

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSoftmaxNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  SoftmaxNDLayerParams *this_00;
  Tensor *this_01;
  int64 iVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string err;
  int rank;
  SoftmaxNDLayerParams *params;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    validateOutputCount((Result *)&params,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,(Result *)&params);
    Result::~Result((Result *)&params);
  }
  this_00 = Specification::NeuralNetworkLayer::softmaxnd
                      ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  iVar2 = Specification::NeuralNetworkLayer::inputtensor_size
                    ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  if (0 < iVar2) {
    this_01 = Specification::NeuralNetworkLayer::inputtensor
                        ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
    err.field_2._12_4_ = Specification::Tensor::rank(this_01);
    iVar3 = Specification::SoftmaxNDLayerParams::axis(this_00);
    if ((iVar3 < (int)-err.field_2._12_4_) ||
       (iVar3 = Specification::SoftmaxNDLayerParams::axis(this_00), (int)err.field_2._12_4_ <= iVar3
       )) {
      __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_
                        ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+(&local_f8,
                     "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",__rhs
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     &local_f8,"\' layer.");
      std::__cxx11::string::~string((string *)&local_f8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d8);
      std::__cxx11::string::~string((string *)local_d8);
      goto LAB_00a3782a;
    }
  }
  Result::Result(__return_storage_ptr__,(Result *)local_48);
LAB_00a3782a:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSoftmaxNDLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.softmaxnd();
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}